

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerMSL::emit_tessellation_io_load
          (CompilerMSL *this,uint32_t result_type_id,uint32_t id,uint32_t ptr)

{
  Types TVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  uint32_t index;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  SPIRType *pSVar8;
  SPIRVariable *pSVar9;
  SPIRType *pSVar10;
  SPIRType *type;
  SPIRType *type_00;
  SPIRType *pSVar11;
  CompilerError *pCVar12;
  uint32_t uVar13;
  string *psVar14;
  uint32_t uVar15;
  uint uVar16;
  bool bVar17;
  SPIRType *local_140;
  AccessChainMeta meta;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  uint32_t local_e4;
  string expr;
  uint32_t indices [2];
  uint local_94;
  ulong local_68;
  string local_50;
  
  pSVar8 = Compiler::expression_type((Compiler *)this,ptr);
  local_140 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,result_type_id);
  if (((pSVar8->storage != StorageClassInput) &&
      ((pSVar8->storage != StorageClassOutput || (bVar3 = is_tese_shader(this), bVar3)))) ||
     (bVar3 = Compiler::has_decoration((Compiler *)this,(ID)ptr,DecorationPatch), bVar3)) {
    return false;
  }
  TVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
          ptr[ptr].type;
  bVar3 = variable_storage_requires_stage_io(this,pSVar8->storage);
  if (bVar3) {
    bVar4 = Compiler::is_matrix((Compiler *)this,local_140);
    bVar17 = true;
    if ((!bVar4) && (bVar4 = Compiler::is_array((Compiler *)this,local_140), !bVar4)) {
      bVar17 = local_140->basetype == Struct;
    }
  }
  else {
    bVar17 = false;
  }
  if (TVar1 == TypeVariable) {
    bVar4 = Compiler::is_array((Compiler *)this,local_140);
    if (!bVar4 && !bVar17) {
      return false;
    }
  }
  else if (!bVar17) {
    return false;
  }
  expr._M_dataplus._M_p = (pointer)&expr.field_2;
  expr._M_string_length = 0;
  expr.field_2._M_local_buf[0] = '\0';
  index = Compiler::get_extended_decoration
                    ((Compiler *)this,ptr,SPIRVCrossDecorationInterfaceMemberIndex);
  pSVar9 = Compiler::maybe_get_backing_variable((Compiler *)this,ptr);
  pSVar10 = Compiler::get_pointee_type((Compiler *)this,(pSVar8->super_IVariant).self.id);
  type = Compiler::expression_type((Compiler *)this,(this->stage_in_ptr_var_id).id);
  if (bVar3) {
    uVar2 = (local_140->array).super_VectorView<unsigned_int>.buffer_size;
    if (2 < uVar2) {
      pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar12,"Cannot load tessellation IO variables with more than 2 dimensions.");
      goto LAB_001ae8df;
    }
    if (uVar2 == 2) {
      if (TVar1 != TypeVariable) {
        pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar12,"Loading an array-of-array must be loaded directly from an IO variable.")
        ;
LAB_001ae8df:
        __cxa_throw(pCVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (index == 0xffffffff) {
        pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar12,"Interface index is unknown. Cannot continue.");
        goto LAB_001ae8df;
      }
      if ((local_140->basetype == Struct) ||
         (bVar3 = Compiler::is_matrix((Compiler *)this,local_140), bVar3)) {
        pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar12,"Cannot load array-of-array of composite type in tessellation IO.");
        goto LAB_001ae8df;
      }
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&meta,this,local_140,0);
      ::std::operator+(&local_108,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meta,
                       "({ ");
      ::std::__cxx11::string::append((string *)&expr);
      ::std::__cxx11::string::~string((string *)&local_108);
      ::std::__cxx11::string::~string((string *)&meta);
      uVar5 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_140,1);
      pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(local_140->parent_type).id);
      uVar15 = 0;
      while (uVar15 != uVar5) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meta,this,
                   pSVar8,0);
        ::std::operator+(&local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meta,
                         "({ ");
        ::std::__cxx11::string::append((string *)&expr);
        ::std::__cxx11::string::~string((string *)&local_108);
        ::std::__cxx11::string::~string((string *)&meta);
        uVar6 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_140,0);
        uVar13 = 0;
        while (uVar6 != uVar13) {
          indices[1] = index + uVar13;
          meta.relaxed_precision = false;
          meta.access_meshlet_position_y = false;
          meta.storage_physical_type = 0;
          meta.need_transpose = false;
          meta.storage_is_packed = false;
          meta.storage_is_invariant = false;
          meta.flattened_struct = false;
          indices[0] = uVar15;
          CompilerGLSL::access_chain_internal_abi_cxx11_
                    (&local_108,&this->super_CompilerGLSL,(this->stage_in_ptr_var_id).id,indices,2,5
                     ,&meta);
          ::std::__cxx11::string::append((string *)&expr);
          ::std::__cxx11::string::~string((string *)&local_108);
          bVar3 = Compiler::is_matrix((Compiler *)this,pSVar8);
          if ((!bVar3 && pSVar8->basetype != Struct) && (pSVar8->vecsize < pSVar10->vecsize)) {
            CompilerGLSL::vector_swizzle(pSVar8->vecsize,0);
            ::std::__cxx11::string::append((char *)&expr);
          }
          uVar13 = uVar13 + 1;
          if (uVar13 < uVar6) {
            ::std::__cxx11::string::append((char *)&expr);
          }
        }
        ::std::__cxx11::string::append((char *)&expr);
        uVar15 = uVar15 + 1;
        if (uVar15 < uVar5) {
          ::std::__cxx11::string::append((char *)&expr);
        }
      }
      ::std::__cxx11::string::append((char *)&expr);
    }
    else if (local_140->basetype == Struct) {
      bVar3 = Compiler::is_array((Compiler *)this,local_140);
      if (bVar3 && TVar1 != TypeVariable) {
        pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar12,
                   "Loading array of struct from IO variable must come directly from IO variable.");
        __cxa_throw(pCVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_e4 = CONCAT31(local_e4._1_3_,bVar3);
      if (bVar3) {
        local_94 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_140,0);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&meta,this,local_140,0);
        ::std::operator+(&local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meta,
                         "({ ");
        ::std::__cxx11::string::append((string *)&expr);
        ::std::__cxx11::string::~string((string *)&local_108);
        ::std::__cxx11::string::~string((string *)&meta);
        local_140 = Compiler::get<spirv_cross::SPIRType>
                              ((Compiler *)this,(local_140->parent_type).id);
      }
      else {
        local_94 = 1;
      }
      if ((local_140->array).super_VectorView<unsigned_int>.buffer_size != 0) {
        __assert_fail("struct_type.array.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                      ,0x1f75,
                      "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                     );
      }
      uVar7 = 0;
      while (uVar7 != local_94) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meta,this,
                   local_140,0);
        ::std::operator+(&local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meta,
                         "{ ");
        ::std::__cxx11::string::append((string *)&expr);
        ::std::__cxx11::string::~string((string *)&local_108);
        ::std::__cxx11::string::~string((string *)&meta);
        local_68 = 0;
        while (local_68 <
               (uint)(local_140->member_types).
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size) {
          if (pSVar9 != (SPIRVariable *)0x0) {
            index = Compiler::get_extended_member_decoration
                              ((Compiler *)this,(pSVar9->super_IVariant).self.id,(uint32_t)local_68,
                               SPIRVCrossDecorationInterfaceMemberIndex);
          }
          if (index == 0xffffffff) {
            pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar12,"Interface index is unknown. Cannot continue.");
            __cxa_throw(pCVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          type_00 = Compiler::get<spirv_cross::SPIRType>
                              ((Compiler *)this,
                               (local_140->member_types).
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                               [local_68].id);
          pSVar11 = Compiler::get<spirv_cross::SPIRType>
                              ((Compiler *)this,
                               (pSVar10->member_types).
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                               [local_68].id);
          bVar3 = Compiler::is_matrix((Compiler *)this,type_00);
          if (bVar3 && pSVar8->storage == StorageClassInput) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meta,
                       this,type_00,0);
            ::std::operator+(&local_108,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &meta,"(");
            ::std::__cxx11::string::append((string *)&expr);
            ::std::__cxx11::string::~string((string *)&local_108);
            ::std::__cxx11::string::~string((string *)&meta);
            uVar16 = 0;
            while (uVar5 = index + uVar16, uVar16 < type_00->columns) {
              if ((char)local_e4 == '\0') {
                CompilerGLSL::to_expression_abi_cxx11_
                          ((string *)indices,&this->super_CompilerGLSL,ptr,true);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&meta,(string *)indices,".");
                CompilerGLSL::to_member_name_abi_cxx11_
                          (&local_50,&this->super_CompilerGLSL,type,uVar5);
                ::std::operator+(&local_108,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&meta,&local_50);
                ::std::__cxx11::string::append((string *)&expr);
                ::std::__cxx11::string::~string((string *)&local_108);
                ::std::__cxx11::string::~string((string *)&local_50);
                ::std::__cxx11::string::~string((string *)&meta);
                psVar14 = (string *)indices;
              }
              else {
                meta.relaxed_precision = false;
                meta.access_meshlet_position_y = false;
                meta.storage_physical_type = 0;
                meta.need_transpose = false;
                meta.storage_is_packed = false;
                meta.storage_is_invariant = false;
                meta.flattened_struct = false;
                psVar14 = &local_108;
                indices[0] = uVar7;
                indices[1] = uVar5;
                CompilerGLSL::access_chain_internal_abi_cxx11_
                          (psVar14,&this->super_CompilerGLSL,(this->stage_in_ptr_var_id).id,indices,
                           2,5,&meta);
                ::std::__cxx11::string::append((string *)&expr);
              }
              ::std::__cxx11::string::~string((string *)psVar14);
              if (type_00->vecsize < pSVar11->vecsize) {
                CompilerGLSL::vector_swizzle(type_00->vecsize,0);
                ::std::__cxx11::string::append((char *)&expr);
              }
              uVar16 = uVar16 + 1;
              if (uVar16 < type_00->columns) {
                ::std::__cxx11::string::append((char *)&expr);
              }
            }
            ::std::__cxx11::string::append((char *)&expr);
            index = uVar5;
          }
          else {
            bVar3 = Compiler::is_array((Compiler *)this,type_00);
            if (bVar3) {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meta,
                         this,type_00,0);
              ::std::operator+(&local_108,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &meta,"({ ");
              ::std::__cxx11::string::append((string *)&expr);
              ::std::__cxx11::string::~string((string *)&local_108);
              ::std::__cxx11::string::~string((string *)&meta);
              uVar5 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type_00,0);
              uVar15 = 0;
              while (uVar6 = index + uVar15, uVar5 != uVar15) {
                if ((char)local_e4 == '\0') {
                  CompilerGLSL::to_expression_abi_cxx11_
                            ((string *)indices,&this->super_CompilerGLSL,ptr,true);
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&meta,(string *)indices,".");
                  CompilerGLSL::to_member_name_abi_cxx11_
                            (&local_50,&this->super_CompilerGLSL,type,uVar6);
                  ::std::operator+(&local_108,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&meta,&local_50);
                  ::std::__cxx11::string::append((string *)&expr);
                  ::std::__cxx11::string::~string((string *)&local_108);
                  ::std::__cxx11::string::~string((string *)&local_50);
                  ::std::__cxx11::string::~string((string *)&meta);
                  psVar14 = (string *)indices;
                }
                else {
                  meta.relaxed_precision = false;
                  meta.access_meshlet_position_y = false;
                  meta.storage_physical_type = 0;
                  meta.need_transpose = false;
                  meta.storage_is_packed = false;
                  meta.storage_is_invariant = false;
                  meta.flattened_struct = false;
                  psVar14 = &local_108;
                  indices[0] = uVar7;
                  indices[1] = uVar6;
                  CompilerGLSL::access_chain_internal_abi_cxx11_
                            (psVar14,&this->super_CompilerGLSL,(this->stage_in_ptr_var_id).id,
                             indices,2,5,&meta);
                  ::std::__cxx11::string::append((string *)&expr);
                }
                ::std::__cxx11::string::~string((string *)psVar14);
                if (type_00->vecsize < pSVar11->vecsize) {
                  CompilerGLSL::vector_swizzle(type_00->vecsize,0);
                  ::std::__cxx11::string::append((char *)&expr);
                }
                uVar15 = uVar15 + 1;
                if (uVar15 < uVar5) {
                  ::std::__cxx11::string::append((char *)&expr);
                }
              }
              ::std::__cxx11::string::append((char *)&expr);
              index = uVar6;
            }
            else {
              if ((char)local_e4 == '\0') {
                CompilerGLSL::to_expression_abi_cxx11_
                          ((string *)indices,&this->super_CompilerGLSL,ptr,true);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&meta,(string *)indices,".");
                CompilerGLSL::to_member_name_abi_cxx11_
                          (&local_50,&this->super_CompilerGLSL,type,index);
                ::std::operator+(&local_108,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&meta,&local_50);
                ::std::__cxx11::string::append((string *)&expr);
                ::std::__cxx11::string::~string((string *)&local_108);
                ::std::__cxx11::string::~string((string *)&local_50);
                ::std::__cxx11::string::~string((string *)&meta);
                psVar14 = (string *)indices;
              }
              else {
                meta.relaxed_precision = false;
                meta.access_meshlet_position_y = false;
                meta.storage_physical_type = 0;
                meta.need_transpose = false;
                meta.storage_is_packed = false;
                meta.storage_is_invariant = false;
                meta.flattened_struct = false;
                psVar14 = &local_108;
                indices[0] = uVar7;
                indices[1] = index;
                CompilerGLSL::access_chain_internal_abi_cxx11_
                          (psVar14,&this->super_CompilerGLSL,(this->stage_in_ptr_var_id).id,indices,
                           2,5,&meta);
                ::std::__cxx11::string::append((string *)&expr);
              }
              ::std::__cxx11::string::~string((string *)psVar14);
              if (type_00->vecsize < pSVar11->vecsize) {
                CompilerGLSL::vector_swizzle(type_00->vecsize,0);
                ::std::__cxx11::string::append((char *)&expr);
              }
            }
          }
          local_68 = local_68 + 1;
          if ((local_68 & 0xffffffff) <
              (local_140->member_types).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size) {
            ::std::__cxx11::string::append((char *)&expr);
          }
        }
        ::std::__cxx11::string::append((char *)&expr);
        uVar7 = uVar7 + 1;
        if (uVar7 < local_94) {
          ::std::__cxx11::string::append((char *)&expr);
        }
      }
      if ((char)local_e4 != '\0') {
        ::std::__cxx11::string::append((char *)&expr);
      }
    }
    else {
      bVar3 = Compiler::is_matrix((Compiler *)this,local_140);
      if (bVar3) {
        bVar3 = Compiler::is_array((Compiler *)this,local_140);
        if (bVar3 && TVar1 != TypeVariable) {
          pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar12,
                     "Loading array of matrix from IO variable must come directly from IO variable."
                    );
LAB_001ae97a:
          __cxa_throw(pCVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (index == 0xffffffff) {
          pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar12,"Interface index is unknown. Cannot continue.");
          goto LAB_001ae97a;
        }
        if (bVar3) {
          uVar5 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_140,0);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&meta,this,local_140,0);
          ::std::operator+(&local_108,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &meta,"({ ");
          ::std::__cxx11::string::append((string *)&expr);
          ::std::__cxx11::string::~string((string *)&local_108);
          ::std::__cxx11::string::~string((string *)&meta);
          pSVar9 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,ptr);
          pSVar8 = Compiler::get_variable_element_type((Compiler *)this,pSVar9);
          uVar15 = 0;
          local_e4 = uVar5;
          while (uVar15 != uVar5) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meta,
                       this,pSVar8,0);
            ::std::operator+(&local_108,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &meta,"(");
            ::std::__cxx11::string::append((string *)&expr);
            ::std::__cxx11::string::~string((string *)&local_108);
            ::std::__cxx11::string::~string((string *)&meta);
            uVar7 = 0;
            while (uVar7 < local_140->columns) {
              indices[1] = index + uVar7;
              meta.relaxed_precision = false;
              meta.access_meshlet_position_y = false;
              meta.storage_physical_type = 0;
              meta.need_transpose = false;
              meta.storage_is_packed = false;
              meta.storage_is_invariant = false;
              meta.flattened_struct = false;
              indices[0] = uVar15;
              CompilerGLSL::access_chain_internal_abi_cxx11_
                        (&local_108,&this->super_CompilerGLSL,(this->stage_in_ptr_var_id).id,indices
                         ,2,5,&meta);
              ::std::__cxx11::string::append((string *)&expr);
              ::std::__cxx11::string::~string((string *)&local_108);
              if (local_140->vecsize < pSVar10->vecsize) {
                CompilerGLSL::vector_swizzle(local_140->vecsize,0);
                ::std::__cxx11::string::append((char *)&expr);
              }
              uVar7 = uVar7 + 1;
              if (uVar7 < local_140->columns) {
                ::std::__cxx11::string::append((char *)&expr);
              }
            }
            ::std::__cxx11::string::append((char *)&expr);
            uVar5 = local_e4;
            uVar15 = uVar15 + 1;
            if (uVar15 < local_e4) {
              ::std::__cxx11::string::append((char *)&expr);
            }
          }
          ::std::__cxx11::string::append((char *)&expr);
        }
        else {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&meta,this,local_140,0);
          ::std::operator+(&local_108,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &meta,"(");
          ::std::__cxx11::string::append((string *)&expr);
          ::std::__cxx11::string::~string((string *)&local_108);
          ::std::__cxx11::string::~string((string *)&meta);
          uVar7 = 0;
          while (uVar7 < local_140->columns) {
            CompilerGLSL::to_expression_abi_cxx11_
                      ((string *)indices,&this->super_CompilerGLSL,ptr,true);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &meta,(string *)indices,".");
            CompilerGLSL::to_member_name_abi_cxx11_
                      (&local_50,&this->super_CompilerGLSL,type,index + uVar7);
            ::std::operator+(&local_108,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &meta,&local_50);
            ::std::__cxx11::string::append((string *)&expr);
            ::std::__cxx11::string::~string((string *)&local_108);
            ::std::__cxx11::string::~string((string *)&local_50);
            ::std::__cxx11::string::~string((string *)&meta);
            ::std::__cxx11::string::~string((string *)indices);
            if (local_140->vecsize < pSVar10->vecsize) {
              CompilerGLSL::vector_swizzle(local_140->vecsize,0);
              ::std::__cxx11::string::append((char *)&expr);
            }
            uVar7 = uVar7 + 1;
            if (uVar7 < local_140->columns) {
              ::std::__cxx11::string::append((char *)&expr);
            }
          }
          ::std::__cxx11::string::append((char *)&expr);
        }
      }
      else if (TVar1 == TypeVariable) {
        bVar3 = Compiler::is_array((Compiler *)this,local_140);
        if (!bVar3) {
          __assert_fail("is_array(result_type)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                        ,0x2009,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if ((local_140->array).super_VectorView<unsigned_int>.buffer_size != 1) {
          __assert_fail("result_type.array.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                        ,0x200a,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if (index == 0xffffffff) {
          pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar12,"Interface index is unknown. Cannot continue.");
          goto LAB_001ae8df;
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&meta,this,local_140,0);
        ::std::operator+(&local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meta,
                         "({ ");
        ::std::__cxx11::string::append((string *)&expr);
        ::std::__cxx11::string::~string((string *)&local_108);
        ::std::__cxx11::string::~string((string *)&meta);
        uVar15 = 0;
        uVar5 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_140,0);
        while (uVar5 != uVar15) {
          meta.relaxed_precision = false;
          meta.access_meshlet_position_y = false;
          meta.storage_physical_type = 0;
          meta.need_transpose = false;
          meta.storage_is_packed = false;
          meta.storage_is_invariant = false;
          meta.flattened_struct = false;
          indices[0] = uVar15;
          indices[1] = index;
          CompilerGLSL::access_chain_internal_abi_cxx11_
                    (&local_108,&this->super_CompilerGLSL,(this->stage_in_ptr_var_id).id,indices,2,5
                     ,&meta);
          ::std::__cxx11::string::append((string *)&expr);
          ::std::__cxx11::string::~string((string *)&local_108);
          if (local_140->vecsize < pSVar10->vecsize) {
            CompilerGLSL::vector_swizzle(local_140->vecsize,0);
            ::std::__cxx11::string::append((char *)&expr);
          }
          uVar15 = uVar15 + 1;
          if (uVar15 < uVar5) {
            ::std::__cxx11::string::append((char *)&expr);
          }
        }
        ::std::__cxx11::string::append((char *)&expr);
      }
      else {
        bVar3 = Compiler::is_array((Compiler *)this,local_140);
        if (!bVar3) {
          __assert_fail("is_array(result_type)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                        ,0x2025,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if ((local_140->array).super_VectorView<unsigned_int>.buffer_size != 1) {
          __assert_fail("result_type.array.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                        ,0x2026,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if (index == 0xffffffff) {
          pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar12,"Interface index is unknown. Cannot continue.");
          goto LAB_001ae8df;
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&meta,this,local_140,0);
        ::std::operator+(&local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meta,
                         "({ ");
        ::std::__cxx11::string::append((string *)&expr);
        ::std::__cxx11::string::~string((string *)&local_108);
        ::std::__cxx11::string::~string((string *)&meta);
        uVar5 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_140,0);
        for (uVar7 = 1; uVar7 - uVar5 != 1; uVar7 = uVar7 + 1) {
          CompilerGLSL::to_expression_abi_cxx11_
                    ((string *)indices,&this->super_CompilerGLSL,ptr,true);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &meta,(string *)indices,".");
          CompilerGLSL::to_member_name_abi_cxx11_(&local_50,&this->super_CompilerGLSL,type,index);
          ::std::operator+(&local_108,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &meta,&local_50);
          ::std::__cxx11::string::append((string *)&expr);
          ::std::__cxx11::string::~string((string *)&local_108);
          ::std::__cxx11::string::~string((string *)&local_50);
          ::std::__cxx11::string::~string((string *)&meta);
          ::std::__cxx11::string::~string((string *)indices);
          if (local_140->vecsize < pSVar10->vecsize) {
            CompilerGLSL::vector_swizzle(local_140->vecsize,0);
            ::std::__cxx11::string::append((char *)&expr);
          }
          if (uVar7 < uVar5) {
            ::std::__cxx11::string::append((char *)&expr);
          }
          index = index + 1;
        }
        ::std::__cxx11::string::append((char *)&expr);
      }
    }
  }
  else {
    if (index == 0xffffffff) {
      bVar3 = false;
      goto LAB_001ada4d;
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&meta,this,local_140,0);
    ::std::operator+(&local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meta,
                     "({ ");
    ::std::__cxx11::string::append((string *)&expr);
    ::std::__cxx11::string::~string((string *)&local_108);
    ::std::__cxx11::string::~string((string *)&meta);
    uVar5 = CompilerGLSL::to_array_size_literal
                      (&this->super_CompilerGLSL,local_140,
                       (int)(local_140->array).super_VectorView<unsigned_int>.buffer_size - 1);
    uVar15 = 0;
    while (uVar5 != uVar15) {
      meta.relaxed_precision = false;
      meta.access_meshlet_position_y = false;
      meta.storage_physical_type = 0;
      meta.need_transpose = false;
      meta.storage_is_packed = false;
      meta.storage_is_invariant = false;
      meta.flattened_struct = false;
      indices[0] = uVar15;
      indices[1] = index;
      CompilerGLSL::access_chain_internal_abi_cxx11_
                (&local_108,&this->super_CompilerGLSL,(this->stage_in_ptr_var_id).id,indices,2,5,
                 &meta);
      ::std::__cxx11::string::append((string *)&expr);
      ::std::__cxx11::string::~string((string *)&local_108);
      uVar15 = uVar15 + 1;
      if (uVar15 < uVar5) {
        ::std::__cxx11::string::append((char *)&expr);
      }
    }
    ::std::__cxx11::string::append((char *)&expr);
  }
  CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type_id,id,&expr,false,false);
  bVar3 = true;
  Compiler::register_read((Compiler *)this,id,ptr,false);
LAB_001ada4d:
  ::std::__cxx11::string::~string((string *)&expr);
  return bVar3;
}

Assistant:

bool CompilerMSL::emit_tessellation_io_load(uint32_t result_type_id, uint32_t id, uint32_t ptr)
{
	auto &ptr_type = expression_type(ptr);
	auto &result_type = get<SPIRType>(result_type_id);
	if (ptr_type.storage != StorageClassInput && ptr_type.storage != StorageClassOutput)
		return false;
	if (ptr_type.storage == StorageClassOutput && is_tese_shader())
		return false;

	if (has_decoration(ptr, DecorationPatch))
		return false;
	bool ptr_is_io_variable = ir.ids[ptr].get_type() == TypeVariable;

	bool flattened_io = variable_storage_requires_stage_io(ptr_type.storage);

	bool flat_data_type = flattened_io &&
	                      (is_matrix(result_type) || is_array(result_type) || result_type.basetype == SPIRType::Struct);

	// Edge case, even with multi-patch workgroups, we still need to unroll load
	// if we're loading control points directly.
	if (ptr_is_io_variable && is_array(result_type))
		flat_data_type = true;

	if (!flat_data_type)
		return false;

	// Now, we must unflatten a composite type and take care of interleaving array access with gl_in/gl_out.
	// Lots of painful code duplication since we *really* should not unroll these kinds of loads in entry point fixup
	// unless we're forced to do this when the code is emitting inoptimal OpLoads.
	string expr;

	uint32_t interface_index = get_extended_decoration(ptr, SPIRVCrossDecorationInterfaceMemberIndex);
	auto *var = maybe_get_backing_variable(ptr);
	auto &expr_type = get_pointee_type(ptr_type.self);

	const auto &iface_type = expression_type(stage_in_ptr_var_id);

	if (!flattened_io)
	{
		// Simplest case for multi-patch workgroups, just unroll array as-is.
		if (interface_index == uint32_t(-1))
			return false;

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, uint32_t(result_type.array.size()) - 1);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			const uint32_t indices[2] = { i, interface_index };
			AccessChainMeta meta;
			expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
			                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else if (result_type.array.size() > 2)
	{
		SPIRV_CROSS_THROW("Cannot load tessellation IO variables with more than 2 dimensions.");
	}
	else if (result_type.array.size() == 2)
	{
		if (!ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading an array-of-array must be loaded directly from an IO variable.");
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");
		if (result_type.basetype == SPIRType::Struct || is_matrix(result_type))
			SPIRV_CROSS_THROW("Cannot load array-of-array of composite type in tessellation IO.");

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, 1);
		uint32_t base_interface_index = interface_index;

		auto &sub_type = get<SPIRType>(result_type.parent_type);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			expr += type_to_glsl(sub_type) + "({ ";
			interface_index = base_interface_index;
			uint32_t array_size = to_array_size_literal(result_type, 0);
			for (uint32_t j = 0; j < array_size; j++, interface_index++)
			{
				const uint32_t indices[2] = { i, interface_index };

				AccessChainMeta meta;
				expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
				                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
				if (!is_matrix(sub_type) && sub_type.basetype != SPIRType::Struct &&
					expr_type.vecsize > sub_type.vecsize)
					expr += vector_swizzle(sub_type.vecsize, 0);

				if (j + 1 < array_size)
					expr += ", ";
			}
			expr += " })";
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else if (result_type.basetype == SPIRType::Struct)
	{
		bool is_array_of_struct = is_array(result_type);
		if (is_array_of_struct && !ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading array of struct from IO variable must come directly from IO variable.");

		uint32_t num_control_points = 1;
		if (is_array_of_struct)
		{
			num_control_points = to_array_size_literal(result_type, 0);
			expr += type_to_glsl(result_type) + "({ ";
		}

		auto &struct_type = is_array_of_struct ? get<SPIRType>(result_type.parent_type) : result_type;
		assert(struct_type.array.empty());

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			expr += type_to_glsl(struct_type) + "{ ";
			for (uint32_t j = 0; j < uint32_t(struct_type.member_types.size()); j++)
			{
				// The base interface index is stored per variable for structs.
				if (var)
				{
					interface_index =
					    get_extended_member_decoration(var->self, j, SPIRVCrossDecorationInterfaceMemberIndex);
				}

				if (interface_index == uint32_t(-1))
					SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

				const auto &mbr_type = get<SPIRType>(struct_type.member_types[j]);
				const auto &expr_mbr_type = get<SPIRType>(expr_type.member_types[j]);
				if (is_matrix(mbr_type) && ptr_type.storage == StorageClassInput)
				{
					expr += type_to_glsl(mbr_type) + "(";
					for (uint32_t k = 0; k < mbr_type.columns; k++, interface_index++)
					{
						if (is_array_of_struct)
						{
							const uint32_t indices[2] = { i, interface_index };
							AccessChainMeta meta;
							expr += access_chain_internal(
									stage_in_ptr_var_id, indices, 2,
									ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
						}
						else
							expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
						if (expr_mbr_type.vecsize > mbr_type.vecsize)
							expr += vector_swizzle(mbr_type.vecsize, 0);

						if (k + 1 < mbr_type.columns)
							expr += ", ";
					}
					expr += ")";
				}
				else if (is_array(mbr_type))
				{
					expr += type_to_glsl(mbr_type) + "({ ";
					uint32_t array_size = to_array_size_literal(mbr_type, 0);
					for (uint32_t k = 0; k < array_size; k++, interface_index++)
					{
						if (is_array_of_struct)
						{
							const uint32_t indices[2] = { i, interface_index };
							AccessChainMeta meta;
							expr += access_chain_internal(
									stage_in_ptr_var_id, indices, 2,
									ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
						}
						else
							expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
						if (expr_mbr_type.vecsize > mbr_type.vecsize)
							expr += vector_swizzle(mbr_type.vecsize, 0);

						if (k + 1 < array_size)
							expr += ", ";
					}
					expr += " })";
				}
				else
				{
					if (is_array_of_struct)
					{
						const uint32_t indices[2] = { i, interface_index };
						AccessChainMeta meta;
						expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
						                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT,
						                              &meta);
					}
					else
						expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
					if (expr_mbr_type.vecsize > mbr_type.vecsize)
						expr += vector_swizzle(mbr_type.vecsize, 0);
				}

				if (j + 1 < struct_type.member_types.size())
					expr += ", ";
			}
			expr += " }";
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		if (is_array_of_struct)
			expr += " })";
	}
	else if (is_matrix(result_type))
	{
		bool is_array_of_matrix = is_array(result_type);
		if (is_array_of_matrix && !ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading array of matrix from IO variable must come directly from IO variable.");
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		if (is_array_of_matrix)
		{
			// Loading a matrix from each control point.
			uint32_t base_interface_index = interface_index;
			uint32_t num_control_points = to_array_size_literal(result_type, 0);
			expr += type_to_glsl(result_type) + "({ ";

			auto &matrix_type = get_variable_element_type(get<SPIRVariable>(ptr));

			for (uint32_t i = 0; i < num_control_points; i++)
			{
				interface_index = base_interface_index;
				expr += type_to_glsl(matrix_type) + "(";
				for (uint32_t j = 0; j < result_type.columns; j++, interface_index++)
				{
					const uint32_t indices[2] = { i, interface_index };

					AccessChainMeta meta;
					expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
					                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
					if (expr_type.vecsize > result_type.vecsize)
						expr += vector_swizzle(result_type.vecsize, 0);
					if (j + 1 < result_type.columns)
						expr += ", ";
				}
				expr += ")";
				if (i + 1 < num_control_points)
					expr += ", ";
			}

			expr += " })";
		}
		else
		{
			expr += type_to_glsl(result_type) + "(";
			for (uint32_t i = 0; i < result_type.columns; i++, interface_index++)
			{
				expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
				if (expr_type.vecsize > result_type.vecsize)
					expr += vector_swizzle(result_type.vecsize, 0);
				if (i + 1 < result_type.columns)
					expr += ", ";
			}
			expr += ")";
		}
	}
	else if (ptr_is_io_variable)
	{
		assert(is_array(result_type));
		assert(result_type.array.size() == 1);
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		// We're loading an array directly from a global variable.
		// This means we're loading one member from each control point.
		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, 0);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			const uint32_t indices[2] = { i, interface_index };

			AccessChainMeta meta;
			expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
			                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
			if (expr_type.vecsize > result_type.vecsize)
				expr += vector_swizzle(result_type.vecsize, 0);

			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else
	{
		// We're loading an array from a concrete control point.
		assert(is_array(result_type));
		assert(result_type.array.size() == 1);
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t array_size = to_array_size_literal(result_type, 0);
		for (uint32_t i = 0; i < array_size; i++, interface_index++)
		{
			expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
			if (expr_type.vecsize > result_type.vecsize)
				expr += vector_swizzle(result_type.vecsize, 0);
			if (i + 1 < array_size)
				expr += ", ";
		}
		expr += " })";
	}

	emit_op(result_type_id, id, expr, false);
	register_read(id, ptr, false);
	return true;
}